

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt__tesselate_cubic
               (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
               float y2,float x3,float y3,float objspace_flatness_squared,int n)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x2_00;
  float y2_00;
  float local_34;
  float local_30;
  
  local_34 = x2;
  local_30 = y2;
  while( true ) {
    fVar2 = (x1 - x0) * (x1 - x0) + (y1 - y0) * (y1 - y0);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar3 = (local_34 - x1) * (local_34 - x1) + (local_30 - y1) * (local_30 - y1);
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = (x3 - local_34) * (x3 - local_34) + (y3 - local_30) * (y3 - local_30);
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar5 = (x3 - x0) * (x3 - x0) + (y3 - y0) * (y3 - y0);
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    if (0x10 < n) break;
    fVar4 = fVar2 + fVar3 + fVar4;
    if (fVar4 * fVar4 - fVar5 * fVar5 <= objspace_flatness_squared) {
      iVar1 = *num_points;
      if (points != (stbtt__point *)0x0) {
        points[iVar1].x = x3;
        points[iVar1].y = y3;
      }
      *num_points = iVar1 + 1;
      return;
    }
    fVar4 = (x0 + x1) * 0.5;
    fVar5 = (y0 + y1) * 0.5;
    fVar2 = (x1 + local_34) * 0.5;
    fVar3 = (y1 + local_30) * 0.5;
    local_34 = (local_34 + x3) * 0.5;
    local_30 = (local_30 + y3) * 0.5;
    x2_00 = (fVar4 + fVar2) * 0.5;
    y2_00 = (fVar5 + fVar3) * 0.5;
    x1 = (fVar2 + local_34) * 0.5;
    y1 = (fVar3 + local_30) * 0.5;
    fVar2 = (x2_00 + x1) * 0.5;
    fVar3 = (y2_00 + y1) * 0.5;
    n = n + 1;
    stbtt__tesselate_cubic
              (points,num_points,x0,y0,fVar4,fVar5,x2_00,y2_00,fVar2,fVar3,objspace_flatness_squared
               ,n);
    y0 = fVar3;
    x0 = fVar2;
  }
  return;
}

Assistant:

static void stbtt__tesselate_cubic(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float x3, float y3, float objspace_flatness_squared, int n)
{
   // @TODO this "flatness" calculation is just made-up nonsense that seems to work well enough
   float dx0 = x1-x0;
   float dy0 = y1-y0;
   float dx1 = x2-x1;
   float dy1 = y2-y1;
   float dx2 = x3-x2;
   float dy2 = y3-y2;
   float dx = x3-x0;
   float dy = y3-y0;
   float longlen = (float) (STBTT_sqrt(dx0*dx0+dy0*dy0)+STBTT_sqrt(dx1*dx1+dy1*dy1)+STBTT_sqrt(dx2*dx2+dy2*dy2));
   float shortlen = (float) STBTT_sqrt(dx*dx+dy*dy);
   float flatness_squared = longlen*longlen-shortlen*shortlen;

   if (n > 16) // 65536 segments on one curve better be enough!
      return;

   if (flatness_squared > objspace_flatness_squared) {
      float x01 = (x0+x1)/2;
      float y01 = (y0+y1)/2;
      float x12 = (x1+x2)/2;
      float y12 = (y1+y2)/2;
      float x23 = (x2+x3)/2;
      float y23 = (y2+y3)/2;

      float xa = (x01+x12)/2;
      float ya = (y01+y12)/2;
      float xb = (x12+x23)/2;
      float yb = (y12+y23)/2;

      float mx = (xa+xb)/2;
      float my = (ya+yb)/2;

      stbtt__tesselate_cubic(points, num_points, x0,y0, x01,y01, xa,ya, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_cubic(points, num_points, mx,my, xb,yb, x23,y23, x3,y3, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x3,y3);
      *num_points = *num_points+1;
   }
}